

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResetAllSchemasOfConnection(sqlite3 *db)

{
  long lVar1;
  void *in_RDI;
  Db *pDb;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  sqlite3BtreeEnterAll((sqlite3 *)0x13c86b);
  for (iVar2 = 0; iVar2 < *(int *)((long)in_RDI + 0x28); iVar2 = iVar2 + 1) {
    if (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)iVar2 * 0x20 + 0x18) != 0) {
      if (*(int *)((long)in_RDI + 0x48) == 0) {
        sqlite3SchemaClear(in_RDI);
      }
      else {
        lVar1 = *(long *)(*(long *)((long)in_RDI + 0x20) + (long)iVar2 * 0x20 + 0x18);
        *(ushort *)(lVar1 + 0x72) = *(ushort *)(lVar1 + 0x72) | 8;
      }
    }
  }
  *(uint *)((long)in_RDI + 0x2c) = *(uint *)((long)in_RDI + 0x2c) & 0xffffffee;
  sqlite3VtabUnlockList((sqlite3 *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  sqlite3BtreeLeaveAll((sqlite3 *)0x13c919);
  if (*(int *)((long)in_RDI + 0x48) == 0) {
    sqlite3CollapseDatabaseArray((sqlite3 *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetAllSchemasOfConnection(sqlite3 *db){
  int i;
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pSchema ){
      if( db->nSchemaLock==0 ){
        sqlite3SchemaClear(pDb->pSchema);
      }else{
        DbSetProperty(db, i, DB_ResetWanted);
      }
    }
  }
  db->mDbFlags &= ~(DBFLAG_SchemaChange|DBFLAG_SchemaKnownOk);
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  if( db->nSchemaLock==0 ){
    sqlite3CollapseDatabaseArray(db);
  }
}